

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

string * __thiscall
higan::HttpRequest::operator[](string *__return_storage_ptr__,HttpRequest *this,string *key)

{
  bool bVar1;
  pointer ppVar2;
  allocator<char> local_31;
  _Self local_30;
  _Self local_28;
  const_iterator result;
  string *key_local;
  HttpRequest *this_local;
  
  result._M_node = (_Base_ptr)key;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->headers_,key);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->headers_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequest::operator[](const std::string& key) const
{
	auto result = headers_.find(key);
	if (result != headers_.end())
	{
		return result->second;
	}
	return "";
}